

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall tinyusdz::MaterialBinding::MaterialBinding(MaterialBinding *this)

{
  MaterialBinding *this_local;
  
  nonstd::optional_lite::optional<tinyusdz::Relationship>::optional(&this->materialBinding);
  nonstd::optional_lite::optional<tinyusdz::Relationship>::optional(&this->materialBindingPreview);
  nonstd::optional_lite::optional<tinyusdz::Relationship>::optional(&this->materialBindingFull);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
  ::map(&this->_materialBindingMap);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>_>_>
  ::map(&this->_materialBindingCollectionMap);
  return;
}

Assistant:

static value::token kAllPurpose() {
    return value::token("");
  }